

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingLinesCase::setUniformsBeforeDrawCall
          (GeometryShaderRenderingLinesCase *this,_draw_call_type drawcall_type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *pTVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bool bVar10;
  bool local_79;
  GLint is_indexed_draw_call_uniform_location;
  GLint is_gl_lines_draw_call_uniform_location;
  GLint is_gl_lines_adjacency_draw_call_uniform_location;
  GLint is_gl_line_strip_adjacency_draw_call_uniform_location;
  GLint is_gl_line_loop_draw_call_uniform_location;
  Functions *gl;
  _draw_call_type drawcall_type_local;
  GeometryShaderRenderingLinesCase *this_local;
  long lVar8;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_GeometryShaderRenderingCase).m_context);
  iVar1 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar8 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_gl_line_loop_draw_call");
  iVar2 = (**(code **)(lVar8 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_gl_line_strip_adjacency_draw_call");
  iVar3 = (**(code **)(lVar8 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_gl_lines_adjacency_draw_call");
  iVar4 = (**(code **)(lVar8 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_gl_lines_draw_call");
  iVar5 = (**(code **)(lVar8 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_indexed_draw_call");
  while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (iVar1 != -1))) {
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (iVar2 != -1))) {
        dVar6 = ::deGetFalse();
        if (dVar6 == 0) {
          while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (iVar3 != -1))) {
            dVar6 = ::deGetFalse();
            if (dVar6 == 0) {
              while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (iVar4 != -1))) {
                dVar6 = ::deGetFalse();
                if (dVar6 == 0) {
                  while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (iVar5 != -1))) {
                    dVar6 = ::deGetFalse();
                    if (dVar6 == 0) {
                      local_79 = true;
                      if ((drawcall_type != DRAW_CALL_TYPE_GL_DRAW_ELEMENTS) &&
                         (local_79 = true,
                         drawcall_type != DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)) {
                        local_79 = drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS;
                      }
                      (**(code **)(lVar8 + 0x14f0))(iVar5,local_79);
                      bVar10 = this->m_drawcall_mode == 2;
                      (**(code **)(lVar8 + 0x14f0))(iVar1,bVar10,extraout_RDX,bVar10);
                      bVar10 = this->m_drawcall_mode == 0xb;
                      (**(code **)(lVar8 + 0x14f0))(iVar2,bVar10,extraout_RDX_00,bVar10);
                      bVar10 = this->m_drawcall_mode == 10;
                      (**(code **)(lVar8 + 0x14f0))(iVar3,bVar10,extraout_RDX_01,bVar10);
                      bVar10 = this->m_drawcall_mode == 1;
                      (**(code **)(lVar8 + 0x14f0))(iVar4,bVar10,extraout_RDX_02,bVar10);
                      return;
                    }
                  }
                  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar9,(char *)0x0,"is_indexed_draw_call_uniform_location != -1",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                             ,0xd1d);
                  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
              }
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,(char *)0x0,"is_gl_lines_draw_call_uniform_location != -1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                         ,0xd1c);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"is_gl_lines_adjacency_draw_call_uniform_location != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xd1b);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"is_gl_line_strip_adjacency_draw_call_uniform_location != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xd1a);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"is_gl_line_loop_draw_call_uniform_location != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xd19);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GeometryShaderRenderingLinesCase::setUniformsBeforeDrawCall(_draw_call_type drawcall_type)
{
	const glw::Functions& gl							  = m_context.getRenderContext().getFunctions();
	glw::GLint is_gl_line_loop_draw_call_uniform_location = gl.getUniformLocation(m_po_id, "is_gl_line_loop_draw_call");
	glw::GLint is_gl_line_strip_adjacency_draw_call_uniform_location =
		gl.getUniformLocation(m_po_id, "is_gl_line_strip_adjacency_draw_call");
	glw::GLint is_gl_lines_adjacency_draw_call_uniform_location =
		gl.getUniformLocation(m_po_id, "is_gl_lines_adjacency_draw_call");
	glw::GLint is_gl_lines_draw_call_uniform_location = gl.getUniformLocation(m_po_id, "is_gl_lines_draw_call");
	glw::GLint is_indexed_draw_call_uniform_location  = gl.getUniformLocation(m_po_id, "is_indexed_draw_call");

	TCU_CHECK(is_gl_line_loop_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_line_strip_adjacency_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_lines_adjacency_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_lines_draw_call_uniform_location != -1);
	TCU_CHECK(is_indexed_draw_call_uniform_location != -1);

	gl.uniform1i(is_indexed_draw_call_uniform_location, (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS));
	gl.uniform1i(is_gl_line_loop_draw_call_uniform_location, (m_drawcall_mode == GL_LINE_LOOP));
	gl.uniform1i(is_gl_line_strip_adjacency_draw_call_uniform_location,
				 (m_drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT));
	gl.uniform1i(is_gl_lines_adjacency_draw_call_uniform_location, (m_drawcall_mode == GL_LINES_ADJACENCY_EXT));
	gl.uniform1i(is_gl_lines_draw_call_uniform_location, (m_drawcall_mode == GL_LINES));
}